

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall
QProcess::start(QProcess *this,QString *program,QStringList *arguments,OpenMode mode)

{
  QProcessPrivate *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((program->d).size != 0) {
      QString::operator=(&this_00->program,program);
      QArrayDataPointer<QString>::operator=(&(this_00->arguments).d,&arguments->d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QProcessPrivate::start(this_00,mode);
        return;
      }
      goto LAB_003cd64d;
    }
    tr((QString *)&local_40,"No program defined",(char *)0x0,-1);
    QProcessPrivate::setErrorAndEmit(this_00,FailedToStart,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
  }
  else {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QProcess::start: Process is already running");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_003cd64d:
  __stack_chk_fail();
}

Assistant:

void QProcess::start(const QString &program, const QStringList &arguments, OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return;
    }
    if (program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return;
    }

    d->program = program;
    d->arguments = arguments;

    d->start(mode);
}